

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ExceptionFilterOptions>::copyConstruct
          (BasicTypeInfo<dap::ExceptionFilterOptions> *this,void *dst,void *src)

{
  void *src_local;
  void *dst_local;
  BasicTypeInfo<dap::ExceptionFilterOptions> *this_local;
  
  ExceptionFilterOptions::ExceptionFilterOptions
            ((ExceptionFilterOptions *)dst,(ExceptionFilterOptions *)src);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }